

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program.cpp
# Opt level: O0

bool __thiscall Options::push_expect_var(Options *this,string_view *info)

{
  char *__beg;
  const_iterator pcVar1;
  bool bVar2;
  const_iterator pcVar3;
  const_iterator pcVar4;
  char *pcVar5;
  char *pcVar6;
  uint *__args_1;
  logic_error *anon_var_1;
  string local_c0;
  uint local_a0;
  optional<unsigned_int> local_9c;
  allocator<char> local_91;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined4 local_70;
  char *local_58;
  char *end_name;
  const_iterator beg_name;
  const_iterator it;
  optional<uint32_t> index;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  string_view *info_local;
  Options *this_local;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&index);
  std::experimental::optional<unsigned_int>::optional((optional<unsigned_int> *)&it);
  beg_name = libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>::begin(info);
  do {
    pcVar4 = beg_name;
    pcVar3 = libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>::end(info);
    pcVar1 = beg_name;
    if (pcVar4 == pcVar3) {
LAB_0035a015:
      bVar2 = std::experimental::optional::operator_cast_to_bool((optional *)&it);
      if (bVar2) {
        __args_1 = std::experimental::optional<unsigned_int>::operator*
                             ((optional<unsigned_int> *)&it);
        std::
        vector<std::pair<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,unsigned_int>,std::allocator<std::pair<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,unsigned_int>>>
        ::
        emplace_back<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,unsigned_int&>
                  ((vector<std::pair<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,unsigned_int>,std::allocator<std::pair<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,unsigned_int>>>
                    *)&this->expect_vars,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&index,__args_1);
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
LAB_0035a08b:
      local_70 = 1;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&index);
      return this_local._7_1_;
    }
    end_name = beg_name;
    pcVar4 = libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>::end(info);
    pcVar5 = std::
             find_if<char_const*,Options::push_expect_var(libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>const&)::__0>
                       (pcVar1,pcVar4);
    local_58 = pcVar5;
    pcVar4 = libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>::end(info);
    __beg = end_name;
    pcVar6 = local_58;
    if ((pcVar5 == pcVar4) || (end_name == local_58)) {
      this_local._7_1_ = false;
      goto LAB_0035a08b;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<char_const*,void>((string *)&local_90,__beg,pcVar6,&local_91);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&index,&local_90
              );
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator(&local_91);
    if (*local_58 == ':') {
      pcVar6 = local_58 + 1;
      pcVar4 = libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>::end(info);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<char_const*,void>
                ((string *)&local_c0,pcVar6,pcVar4,(allocator<char> *)((long)&anon_var_1 + 7));
      local_a0 = std::__cxx11::stoi(&local_c0,(size_t *)0x0,10);
      std::experimental::optional<unsigned_int>::optional(&local_9c,&local_a0);
      std::experimental::optional<unsigned_int>::operator=((optional<unsigned_int> *)&it,&local_9c);
      std::__cxx11::string::~string((string *)&local_c0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&anon_var_1 + 7));
      goto LAB_0035a015;
    }
    beg_name = std::next<char_const*>(local_58,1);
  } while( true );
}

Assistant:

bool Options::push_expect_var(const string_view& info)
{
    std::vector<std::string> names;
    optional<uint32_t> index;

    try
    {
        for(auto it = info.begin(); it != info.end(); )
        {
            auto beg_name = it;
            auto end_name = std::find_if(beg_name, info.end(), [](char c) { return c == ',' || c == ':'; });

            if(end_name == info.end() || beg_name == end_name)
                return false;

            names.emplace_back(std::string(beg_name, end_name));
            if(*end_name == ':')
            {
                index = std::stoi(std::string(end_name+1, info.end()));
                break;
            }

            it = std::next(end_name);
        }
    }
    catch(const std::logic_error&)
    {
        return false;
    }

    if(index)
    {
        this->expect_vars.emplace_back(std::move(names), *index);
        return true;
    }

    return false;
}